

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O1

ISPCCamera * __thiscall
embree::Camera::getISPCCamera
          (ISPCCamera *__return_storage_ptr__,Camera *this,size_t width,size_t height)

{
  float fVar1;
  float fVar2;
  float fVar3;
  AffineSpace3fa local2world;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  float local_58;
  float fStack_54;
  float fStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  
  fVar1 = tanf(this->fov * 0.5 * 0.017453292);
  camera2world((AffineSpace3fa *)&local_68.field_1,this);
  fVar2 = (float)width * -0.5;
  fVar3 = (float)height * 0.5;
  fVar1 = fVar3 * (1.0 / fVar1);
  (__return_storage_ptr__->xfm).l.vx.field_0.field_0.x = local_68.m128[0];
  (__return_storage_ptr__->xfm).l.vx.field_0.field_0.y = local_68.m128[1];
  (__return_storage_ptr__->xfm).l.vx.field_0.field_0.z = local_68.m128[2];
  (__return_storage_ptr__->xfm).l.vy.field_0.field_0.x = -local_58;
  (__return_storage_ptr__->xfm).l.vy.field_0.field_0.y = -fStack_54;
  (__return_storage_ptr__->xfm).l.vy.field_0.field_0.z = -fStack_50;
  (__return_storage_ptr__->xfm).l.vz.field_0.field_0.x =
       fVar1 * local_48 + fVar2 * local_68.m128[0] + fVar3 * local_58;
  (__return_storage_ptr__->xfm).l.vz.field_0.field_0.y =
       fVar1 * fStack_44 + fVar2 * local_68.m128[1] + fVar3 * fStack_54;
  (__return_storage_ptr__->xfm).l.vz.field_0.field_0.z =
       fVar1 * fStack_40 + fVar2 * local_68.m128[2] + fVar3 * fStack_50;
  (__return_storage_ptr__->xfm).p.field_0.field_0.x = local_38;
  (__return_storage_ptr__->xfm).p.field_0.field_0.y = fStack_34;
  (__return_storage_ptr__->xfm).p.field_0.field_0.z = fStack_30;
  __return_storage_ptr__->render_time = 0.0;
  return __return_storage_ptr__;
}

Assistant:

ISPCCamera getISPCCamera (size_t width, size_t height)
    {
      const float fovScale = 1.0f/tanf(deg2rad(0.5f*fov));
      const AffineSpace3fa local2world = camera2world();
      Vec3fa vx = local2world.l.vx;
      Vec3fa vy = -local2world.l.vy;
      Vec3fa vz = -0.5f*width*local2world.l.vx + 0.5f*height*local2world.l.vy + 0.5f*height*fovScale*local2world.l.vz;
      Vec3fa p =  local2world.p;
      return ISPCCamera(AffineSpace3f(vx,vy,vz,p));
    }